

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  ThreadSafeArena *this_00;
  Extension *this_01;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_02;
  Nonnull<const_char_*> pcVar1;
  ThreadSafeArena *pTVar2;
  ExtensionSet *this_03;
  Extension *unaff_R14;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  if (message == (MessageLite *)0x0) {
    this_01 = FindOrNull(this,number);
    if (this_01 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(this_01);
    return;
  }
  this_00 = &this->arena_->impl_;
  pTVar2 = (ThreadSafeArena *)(message->_internal_metadata_).ptr_;
  if (((ulong)pTVar2 & 1) != 0) {
    pTVar2 = *(ThreadSafeArena **)((ulong)pTVar2 & 0xfffffffffffffffe);
  }
  if (pTVar2 == this_00 || pTVar2 == (ThreadSafeArena *)0x0) {
    pVar3 = Insert(this,number);
    unaff_R14 = pVar3.first;
    unaff_R14->descriptor = descriptor;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (unaff_R14->is_repeated != false) goto LAB_0023f588;
      pcVar1 = (Nonnull<const_char_*>)0x0;
      goto LAB_0023f4b0;
    }
    unaff_R14->type = type;
    if ((byte)(type - 0x13) < 0xee) goto LAB_0023f57e;
    this_03 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (this_03 != (ExtensionSet *)0xa) goto LAB_0023f5aa;
    pcVar1 = (Nonnull<const_char_*>)0x0;
LAB_0023f460:
    if (pcVar1 != (Nonnull<const_char_*>)0x0) {
LAB_0023f5e3:
      SetAllocatedMessage();
LAB_0023f5f0:
      SetAllocatedMessage();
    }
    unaff_R14->is_repeated = false;
    unaff_R14->field_0xa = (unaff_R14->field_0xa & 0xfa) + 1;
  }
  else {
    SetAllocatedMessage((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_0023f57e:
    SetAllocatedMessage((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_0023f588:
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
LAB_0023f4b0:
    if (pcVar1 != (Nonnull<const_char_*>)0x0) {
      SetAllocatedMessage();
      goto LAB_0023f5e3;
    }
    if ((byte)(unaff_R14->type - 0x13) < 0xee) {
      this_03 = (ExtensionSet *)&stack0xffffffffffffffc0;
      SetAllocatedMessage(this_03);
LAB_0023f5aa:
      pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)this_03,10,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
      goto LAB_0023f460;
    }
    if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)unaff_R14->type * 4) == 10)
    {
      pcVar1 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                          (ulong)unaff_R14->type * 4),10,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    }
    if (pcVar1 != (Nonnull<const_char_*>)0x0) goto LAB_0023f5f0;
    if ((unaff_R14->field_0xa & 4) != 0) {
      (**(code **)(**(long **)&(unaff_R14->field_0).int32_t_value + 0x30))
                (*(long **)&(unaff_R14->field_0).int32_t_value,message,this_00);
      goto LAB_0023f553;
    }
    if ((this_00 == (ThreadSafeArena *)0x0) &&
       ((long *)(unaff_R14->field_0).int64_t_value != (long *)0x0)) {
      (**(code **)(*(long *)(unaff_R14->field_0).int64_t_value + 8))();
    }
  }
  if (pTVar2 == this_00) {
    unaff_R14->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
  }
  else if (pTVar2 == (ThreadSafeArena *)0x0) {
    unaff_R14->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
    ThreadSafeArena::AddCleanup(this_00,message,arena_delete_object<google::protobuf::MessageLite>);
  }
  else {
    this_02 = (anon_union_8_9_fdc4a54a_for_Extension_0)MessageLite::New(message,(Arena *)this_00);
    unaff_R14->field_0 = this_02;
    MessageLite::CheckTypeAndMergeFrom((MessageLite *)this_02,message);
  }
LAB_0023f553:
  unaff_R14->field_0xa = unaff_R14->field_0xa & 0xfd;
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Arena* const arena = arena_;
  Arena* const message_arena = message->GetArena();
  ABSL_DCHECK(message_arena == nullptr || message_arena == arena);

  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    if (message_arena == arena) {
      extension->ptr.message_value = message;
    } else if (message_arena == nullptr) {
      extension->ptr.message_value = message;
      arena->Own(message);  // not nullptr because not equal to message_arena
    } else {
      extension->ptr.message_value = message->New(arena);
      extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->SetAllocatedMessage(message, arena);
    } else {
      if (arena == nullptr) {
        delete extension->ptr.message_value;
      }
      if (message_arena == arena) {
        extension->ptr.message_value = message;
      } else if (message_arena == nullptr) {
        extension->ptr.message_value = message;
        arena->Own(message);  // not nullptr because not equal to message_arena
      } else {
        extension->ptr.message_value = message->New(arena);
        extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}